

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O3

Person * __thiscall hiberlite::real_bean<Person>::get(real_bean<Person> *this)

{
  int *piVar1;
  long lVar2;
  Person *pPVar3;
  runtime_error *this_00;
  bean_key local_28;
  
  if (this->forgotten == false) {
    lVar2 = (this->key).id;
    pPVar3 = this->obj;
    if (lVar2 != -1 && pPVar3 == (Person *)0x0) {
      local_28.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
      local_28.con.res = (this->key).con.res;
      if (local_28.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        (local_28.con.res)->refCount = (local_28.con.res)->refCount + 1;
      }
      local_28.id = lVar2;
      pPVar3 = Database::dbLoad<Person>(&local_28);
      this->obj = pPVar3;
      local_28.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
      if (local_28.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
        piVar1 = &(local_28.con.res)->refCount;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (*(local_28.con.res)->_vptr_shared_cnt_obj_pair[1])();
          pPVar3 = this->obj;
        }
      }
    }
    if (pPVar3 == (Person *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"NULL pointer exception!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pPVar3 = (Person *)0x0;
  }
  return pPVar3;
}

Assistant:

C* real_bean<C>::get()
{
	if(forgotten)
		return NULL;
	loadLazy();
	if(!obj)
		throw std::runtime_error("NULL pointer exception!");
	return obj;
}